

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<kj::TaskSet::Task>::disposeImpl
          (HeapDisposer<kj::TaskSet::Task> *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    TaskSet::Task::~Task((Task *)pointer);
  }
  operator_delete(pointer,0x58);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }